

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runsuite.c
# Opt level: O2

int main(int argc,char **argv)

{
  int iVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  xmlNodePtr pxVar5;
  xmlChar *pxVar6;
  xmlNodePtr cur;
  char *pcVar7;
  int iVar8;
  bool bVar9;
  
  logfile = (FILE *)fopen64("runsuite.log","wb");
  if ((FILE *)logfile == (FILE *)0x0) {
    fwrite("Could not open the log file, running in verbose mode\n",0x35,1,_stderr);
    verbose = '\x01';
  }
  xmlMemSetup(xmlMemFree,xmlMemMalloc,xmlMemRealloc,xmlMemoryStrdup);
  xmlInitParser();
  ctxtXPath = (xmlXPathContextPtr_conflict)xmlXPathNewContext(0);
  if (ctxtXPath->cache != (void *)0x0) {
    xmlXPathContextSetCache(ctxtXPath,0,0xffffffffffffffff,0);
  }
  xmlXPathRegisterNs(ctxtXPath,"ts","TestSuite");
  xmlXPathRegisterNs(ctxtXPath,"xlink","http://www.w3.org/1999/xlink");
  xmlSetGenericErrorFunc(0,testErrorHandler);
  xmlInitializeCatalog();
  xmlCatalogSetDefaults(0);
  xmlSchemaInitTypes();
  xmlRelaxNGInitTypes();
  iVar2 = nb_leaks;
  iVar1 = nb_tests;
  iVar8 = nb_errors;
  if ((((1 < argc) && (pcVar7 = argv[1], *pcVar7 == '-')) && (pcVar7[1] == 'v')) &&
     (pcVar7[2] == '\0')) {
    verbose = '\x01';
  }
  lVar4 = xmlReadFile("test/xsdtest/xsdtestsuite.xml",0,2);
  if (lVar4 == 0) {
    fprintf(_stderr,"Failed to parse %s\n","test/xsdtest/xsdtestsuite.xml");
  }
  else {
    puts("## XML Schemas datatypes test suite from James Clark");
    pxVar5 = (xmlNodePtr)xmlDocGetRootElement(lVar4);
    if (((pxVar5 == (xmlNodePtr)0x0) || (iVar3 = xmlStrEqual(pxVar5->name,"testSuite"), iVar3 == 0))
       || ((pxVar5 = getNext(pxVar5,"./testSuite[1]"), pxVar5 == (xmlNodePtr)0x0 ||
           (iVar3 = xmlStrEqual(pxVar5->name,"testSuite"), iVar3 == 0)))) {
      fprintf(_stderr,"Unexpected format %s\n","test/xsdtest/xsdtestsuite.xml");
    }
    else {
      for (; pxVar5 != (xmlNodePtr)0x0; pxVar5 = getNext(pxVar5,"following-sibling::testSuite[1]"))
      {
        xsdTestSuite(pxVar5);
      }
    }
    xmlFreeDoc(lVar4);
  }
  printf("Ran %d tests, %d errors, %d leaks\n",(ulong)(uint)(nb_tests - iVar1),
         (ulong)(uint)(nb_errors - iVar8),(ulong)(uint)(nb_leaks - iVar2));
  if (nb_errors - iVar8 == 3) {
    printf("%d errors were expected\n",3);
  }
  else {
    printf("%d errors were expected, got %d errors\n",3);
    iVar8 = iVar8 + 1;
  }
  iVar2 = nb_leaks;
  iVar1 = nb_tests;
  nb_errors = iVar8;
  lVar4 = xmlReadFile("test/relaxng/OASIS/spectest.xml",0,2);
  if (lVar4 == 0) {
    fprintf(_stderr,"Failed to parse %s\n","test/relaxng/OASIS/spectest.xml");
  }
  else {
    puts("## Relax NG test suite from James Clark");
    pxVar5 = (xmlNodePtr)xmlDocGetRootElement(lVar4);
    if (((pxVar5 == (xmlNodePtr)0x0) || (iVar3 = xmlStrEqual(pxVar5->name,"testSuite"), iVar3 == 0))
       || ((pxVar5 = getNext(pxVar5,"./testSuite[1]"), pxVar5 == (xmlNodePtr)0x0 ||
           (iVar3 = xmlStrEqual(pxVar5->name,"testSuite"), iVar3 == 0)))) {
      fprintf(_stderr,"Unexpected format %s\n","test/relaxng/OASIS/spectest.xml");
    }
    else {
      for (; pxVar5 != (xmlNodePtr)0x0; pxVar5 = getNext(pxVar5,"following-sibling::testSuite[1]"))
      {
        if (verbose == '\x01') {
          pxVar6 = getString(pxVar5,"string(documentation)");
          if (pxVar6 == (xmlChar *)0x0) {
            pxVar6 = getString(pxVar5,"string(section)");
            if (pxVar6 == (xmlChar *)0x0) goto LAB_001028e1;
            pcVar7 = "Section %s\n";
          }
          else {
            pcVar7 = "Suite %s\n";
          }
          printf(pcVar7,pxVar6);
          (*_xmlFree)(pxVar6);
        }
LAB_001028e1:
        pcVar7 = "./testSuite[1]";
        cur = pxVar5;
        while (cur = getNext(cur,pcVar7), cur != (xmlNodePtr)0x0) {
          xsdTestSuite(cur);
          pcVar7 = "following-sibling::testSuite[1]";
        }
      }
    }
    xmlFreeDoc(lVar4);
  }
  if (nb_leaks == iVar2 && nb_errors == iVar8) {
    printf("Ran %d tests, no errors\n",(ulong)(uint)(nb_tests - iVar1));
  }
  else {
    printf("Ran %d tests, %d errors, %d leaks\n",(ulong)(uint)(nb_tests - iVar1),
           (ulong)(uint)(nb_errors - iVar8),(ulong)(uint)(nb_leaks - iVar2));
  }
  iVar2 = nb_leaks;
  iVar1 = nb_tests;
  iVar8 = nb_errors;
  lVar4 = xmlReadFile("test/relaxng/testsuite.xml",0,2);
  if (lVar4 == 0) {
    fprintf(_stderr,"Failed to parse %s\n","test/relaxng/testsuite.xml");
  }
  else {
    puts("## Relax NG test suite for libxml2");
    pxVar5 = (xmlNodePtr)xmlDocGetRootElement(lVar4);
    if ((((pxVar5 == (xmlNodePtr)0x0) || (iVar3 = xmlStrEqual(pxVar5->name,"testSuite"), iVar3 == 0)
         ) || (pxVar5 = getNext(pxVar5,"./testSuite[1]"), pxVar5 == (xmlNodePtr)0x0)) ||
       (iVar3 = xmlStrEqual(pxVar5->name,"testSuite"), iVar3 == 0)) {
      fprintf(_stderr,"Unexpected format %s\n","test/relaxng/testsuite.xml");
    }
    else {
      for (; pxVar5 != (xmlNodePtr)0x0; pxVar5 = getNext(pxVar5,"following-sibling::testSuite[1]"))
      {
        xsdTestSuite(pxVar5);
      }
    }
    xmlFreeDoc(lVar4);
  }
  if (nb_leaks == iVar2 && nb_errors == iVar8) {
    printf("Ran %d tests, no errors\n",(ulong)(uint)(nb_tests - iVar1));
  }
  else {
    printf("Ran %d tests, %d errors, %d leaks\n",(ulong)(uint)(nb_tests - iVar1),
           (ulong)(uint)(nb_errors - iVar8),(ulong)(uint)(nb_leaks - iVar2));
  }
  iVar2 = nb_leaks;
  iVar1 = nb_tests;
  iVar8 = nb_errors;
  nb_internals = 0;
  nb_schematas = 0;
  xstcMetadata("xstc/Tests/Metadata/NISTXMLSchemaDatatypes.testSet","xstc/Tests/Metadata/");
  if (nb_leaks == iVar2 && nb_errors == iVar8) {
    printf("Ran %d tests (%d schemata), no errors\n",(ulong)(uint)(nb_tests - iVar1),
           (ulong)(uint)nb_schematas);
  }
  else {
    printf("Ran %d tests (%d schemata), %d errors (%d internals), %d leaks\n",
           (ulong)(uint)(nb_tests - iVar1),(ulong)(uint)nb_schematas,
           (ulong)(uint)(nb_errors - iVar8),(ulong)(uint)nb_internals,
           (ulong)(uint)(nb_leaks - iVar2));
  }
  iVar2 = nb_leaks;
  iVar1 = nb_tests;
  iVar8 = nb_errors;
  nb_internals = 0;
  nb_schematas = 0;
  xstcMetadata("xstc/Tests/Metadata/SunXMLSchema1-0-20020116.testSet","xstc/Tests/");
  if (nb_leaks == iVar2 && nb_errors == iVar8) {
    printf("Ran %d tests (%d schemata), no errors\n",(ulong)(uint)(nb_tests - iVar1),
           (ulong)(uint)nb_schematas);
  }
  else {
    printf("Ran %d tests (%d schemata), %d errors (%d internals), %d leaks\n",
           (ulong)(uint)(nb_tests - iVar1),(ulong)(uint)nb_schematas,
           (ulong)(uint)(nb_errors - iVar8),(ulong)(uint)nb_internals,
           (ulong)(uint)(nb_leaks - iVar2));
    puts("Some errors were expected.");
    nb_errors = iVar8;
  }
  iVar2 = nb_leaks;
  iVar1 = nb_tests;
  iVar8 = nb_errors;
  nb_internals = 0;
  nb_schematas = 0;
  xstcMetadata("xstc/Tests/Metadata/MSXMLSchema1-0-20020116.testSet","xstc/Tests/");
  if (nb_leaks == iVar2 && nb_errors == iVar8) {
    printf("Ran %d tests (%d schemata), no errors\n",(ulong)(uint)(nb_tests - iVar1),
           (ulong)(uint)nb_schematas);
  }
  else {
    printf("Ran %d tests (%d schemata), %d errors (%d internals), %d leaks\n",
           (ulong)(uint)(nb_tests - iVar1),(ulong)(uint)nb_schematas,
           (ulong)(uint)(nb_errors - iVar8),(ulong)(uint)nb_internals,
           (ulong)(uint)(nb_leaks - iVar2));
    puts("Some errors were expected.");
    nb_errors = iVar8;
  }
  bVar9 = nb_errors != 0 || nb_leaks != 0;
  if (bVar9) {
    printf("Total %d tests, %d errors, %d leaks\n",(ulong)(uint)nb_tests,(ulong)(uint)nb_errors);
  }
  else {
    printf("Total %d tests, no errors\n",(ulong)(uint)nb_tests);
  }
  xmlXPathFreeContext(ctxtXPath);
  xmlCleanupParser();
  if (logfile != (FILE *)0x0) {
    fclose((FILE *)logfile);
  }
  return (uint)bVar9;
}

Assistant:

int
main(int argc ATTRIBUTE_UNUSED, char **argv ATTRIBUTE_UNUSED) {
    int ret = 0;
    int old_errors, old_tests, old_leaks;
#ifdef LIBXML_RELAXNG_ENABLED
    int expected_errors;
#endif

    logfile = fopen(LOGFILE, "wb");
    if (logfile == NULL) {
        fprintf(stderr,
	        "Could not open the log file, running in verbose mode\n");
	verbose = 1;
    }
    initializeLibxml2();

    if ((argc >= 2) && (!strcmp(argv[1], "-v")))
        verbose = 1;

#ifdef LIBXML_RELAXNG_ENABLED
    old_errors = nb_errors;
    old_tests = nb_tests;
    old_leaks = nb_leaks;
    xsdTest();
    expected_errors = 3;
    printf("Ran %d tests, %d errors, %d leaks\n",
           nb_tests - old_tests,
           nb_errors - old_errors,
           nb_leaks - old_leaks);
    if (nb_errors - old_errors == expected_errors) {
        printf("%d errors were expected\n", expected_errors);
        nb_errors = old_errors;
    } else {
        printf("%d errors were expected, got %d errors\n",
               expected_errors, nb_errors - old_errors);
        nb_errors = old_errors + 1;
    }

    old_errors = nb_errors;
    old_tests = nb_tests;
    old_leaks = nb_leaks;
    rngTest1();
    if ((nb_errors == old_errors) && (nb_leaks == old_leaks))
	printf("Ran %d tests, no errors\n", nb_tests - old_tests);
    else
	printf("Ran %d tests, %d errors, %d leaks\n",
	       nb_tests - old_tests,
	       nb_errors - old_errors,
	       nb_leaks - old_leaks);

    old_errors = nb_errors;
    old_tests = nb_tests;
    old_leaks = nb_leaks;
    rngTest2();
    if ((nb_errors == old_errors) && (nb_leaks == old_leaks))
	printf("Ran %d tests, no errors\n", nb_tests - old_tests);
    else
	printf("Ran %d tests, %d errors, %d leaks\n",
	       nb_tests - old_tests,
	       nb_errors - old_errors,
	       nb_leaks - old_leaks);
#endif /* LIBXML_RELAXNG_ENABLED */

#ifdef LIBXML_SCHEMAS_ENABLED
    old_errors = nb_errors;
    old_tests = nb_tests;
    old_leaks = nb_leaks;
    nb_internals = 0;
    nb_schematas = 0;
    xstcMetadata("xstc/Tests/Metadata/NISTXMLSchemaDatatypes.testSet",
		 "xstc/Tests/Metadata/");
    if ((nb_errors == old_errors) && (nb_leaks == old_leaks))
	printf("Ran %d tests (%d schemata), no errors\n",
	       nb_tests - old_tests, nb_schematas);
    else
	printf("Ran %d tests (%d schemata), %d errors (%d internals), %d leaks\n",
	       nb_tests - old_tests,
	       nb_schematas,
	       nb_errors - old_errors,
	       nb_internals,
	       nb_leaks - old_leaks);

    old_errors = nb_errors;
    old_tests = nb_tests;
    old_leaks = nb_leaks;
    nb_internals = 0;
    nb_schematas = 0;
    xstcMetadata("xstc/Tests/Metadata/SunXMLSchema1-0-20020116.testSet",
		 "xstc/Tests/");
    if ((nb_errors == old_errors) && (nb_leaks == old_leaks)) {
	printf("Ran %d tests (%d schemata), no errors\n",
	       nb_tests - old_tests, nb_schematas);
    } else {
	printf("Ran %d tests (%d schemata), %d errors (%d internals), %d leaks\n",
	       nb_tests - old_tests,
	       nb_schematas,
	       nb_errors - old_errors,
	       nb_internals,
	       nb_leaks - old_leaks);
        printf("Some errors were expected.\n");
        nb_errors = old_errors;
    }

    old_errors = nb_errors;
    old_tests = nb_tests;
    old_leaks = nb_leaks;
    nb_internals = 0;
    nb_schematas = 0;
    xstcMetadata("xstc/Tests/Metadata/MSXMLSchema1-0-20020116.testSet",
		 "xstc/Tests/");
    if ((nb_errors == old_errors) && (nb_leaks == old_leaks)) {
	printf("Ran %d tests (%d schemata), no errors\n",
	       nb_tests - old_tests, nb_schematas);
    } else {
	printf("Ran %d tests (%d schemata), %d errors (%d internals), %d leaks\n",
	       nb_tests - old_tests,
	       nb_schematas,
	       nb_errors - old_errors,
	       nb_internals,
	       nb_leaks - old_leaks);
        printf("Some errors were expected.\n");
        nb_errors = old_errors;
    }
#endif /* LIBXML_SCHEMAS_ENABLED */

    if ((nb_errors == 0) && (nb_leaks == 0)) {
        ret = 0;
	printf("Total %d tests, no errors\n",
	       nb_tests);
    } else {
        ret = 1;
	printf("Total %d tests, %d errors, %d leaks\n",
	       nb_tests, nb_errors, nb_leaks);
    }
    xmlXPathFreeContext(ctxtXPath);
    xmlCleanupParser();

    if (logfile != NULL)
        fclose(logfile);
    return(ret);
}